

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  ostream *poVar2;
  long lVar3;
  undefined8 *puVar4;
  ofstream *poVar5;
  pointer pdVar6;
  byte bVar7;
  initializer_list<double> __l;
  Polynomial<double> p1;
  Polynomial<double> p2;
  Filter<double> filterLowPass2nd;
  Polynomial<double> p3;
  Polynomial<double> p4;
  ofstream outF;
  StateSpaceFilter<double> ssFilter;
  vector<double,_std::allocator<double>_> times;
  string local_478;
  vector<double,_std::allocator<double>_> aMa;
  vector<double,_std::allocator<double>_> bMa;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  Polynomial<double> local_368;
  Polynomial<double> local_340;
  Filter<double> emptyFilter;
  TransferFunction<double> local_278;
  Filter<double> filterLowPass6th;
  TransferFunction<double> lowPass2nd;
  TransferFunction<double> lowPass6th;
  Filter<double> maFilter;
  
  bVar7 = 0;
  poVar2 = std::operator<<((ostream *)&std::cout,"--------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"|        TEST #1         |");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"|       Polynomial       |");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"--------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  _outF = &filterLowPass2nd;
  filterLowPass2nd.tf_.samplingFrequency_ = 1.0;
  filterLowPass2nd.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4000000000000000;
  rtb::Filter::Polynomial<double>::Polynomial(&p1,(initializer_list<double> *)&outF);
  _outF = (Filter<double> *)0x3ff0000000000000;
  filterLowPass2nd.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3;
  filterLowPass2nd.tf_.samplingFrequency_ = (double)&outF;
  rtb::Filter::Polynomial<double>::Polynomial(&p2,(initializer_list<double> *)&filterLowPass2nd);
  _outF = (Filter<double> *)0x0;
  filterLowPass2nd.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4;
  filterLowPass2nd.tf_.samplingFrequency_ = (double)&outF;
  rtb::Filter::Polynomial<double>::Polynomial(&p3,(initializer_list<double> *)&filterLowPass2nd);
  filterLowPass2nd.tf_.samplingFrequency_ = 5.0;
  _outF = &filterLowPass2nd;
  rtb::Filter::Polynomial<double>::Polynomial(&p4,(initializer_list<double> *)&outF);
  poVar2 = std::operator<<((ostream *)&std::cout,"p1 =");
  rtb::Filter::operator<<(poVar2,&p1);
  poVar2 = std::operator<<((ostream *)&std::cout,"p2 =");
  rtb::Filter::operator<<(poVar2,&p2);
  poVar2 = std::operator<<((ostream *)&std::cout,"p3 =");
  rtb::Filter::operator<<(poVar2,&p3);
  poVar2 = std::operator<<((ostream *)&std::cout,"p4 =");
  rtb::Filter::operator<<(poVar2,&p4);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<((ostream *)&std::cout,"Scalar Multiplication");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"p1 * 2 = ");
  emptyFilter.tf_.samplingFrequency_ = 2.0;
  filterLowPass6th.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  filterLowPass6th.tf_.samplingFrequency_ = (double)&emptyFilter;
  rtb::Filter::Polynomial<double>::Polynomial
            ((Polynomial<double> *)&filterLowPass2nd,(initializer_list<double> *)&filterLowPass6th);
  rtb::Filter::multiply<double>
            ((Polynomial<double> *)&outF,&p1,(Polynomial<double> *)&filterLowPass2nd);
  poVar2 = rtb::Filter::operator<<(poVar2,(Polynomial<double> *)&outF);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&outF);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &filterLowPass2nd);
  poVar2 = std::operator<<((ostream *)&std::cout,"p2 * 3 = ");
  emptyFilter.tf_.samplingFrequency_ = 3.0;
  filterLowPass6th.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  filterLowPass6th.tf_.samplingFrequency_ = (double)&emptyFilter;
  rtb::Filter::Polynomial<double>::Polynomial
            ((Polynomial<double> *)&filterLowPass2nd,(initializer_list<double> *)&filterLowPass6th);
  rtb::Filter::multiply<double>
            ((Polynomial<double> *)&outF,&p2,(Polynomial<double> *)&filterLowPass2nd);
  poVar2 = rtb::Filter::operator<<(poVar2,(Polynomial<double> *)&outF);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&outF);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &filterLowPass2nd);
  poVar2 = std::operator<<((ostream *)&std::cout,"p3 * 4 = ");
  emptyFilter.tf_.samplingFrequency_ = 4.0;
  filterLowPass6th.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  filterLowPass6th.tf_.samplingFrequency_ = (double)&emptyFilter;
  rtb::Filter::Polynomial<double>::Polynomial
            ((Polynomial<double> *)&filterLowPass2nd,(initializer_list<double> *)&filterLowPass6th);
  rtb::Filter::multiply<double>
            ((Polynomial<double> *)&outF,&p3,(Polynomial<double> *)&filterLowPass2nd);
  poVar2 = rtb::Filter::operator<<(poVar2,(Polynomial<double> *)&outF);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&outF);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &filterLowPass2nd);
  poVar2 = std::operator<<((ostream *)&std::cout,"p4 * 5 = ");
  emptyFilter.tf_.samplingFrequency_ = 5.0;
  filterLowPass6th.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  filterLowPass6th.tf_.samplingFrequency_ = (double)&emptyFilter;
  rtb::Filter::Polynomial<double>::Polynomial
            ((Polynomial<double> *)&filterLowPass2nd,(initializer_list<double> *)&filterLowPass6th);
  rtb::Filter::multiply<double>
            ((Polynomial<double> *)&outF,&p4,(Polynomial<double> *)&filterLowPass2nd);
  poVar2 = rtb::Filter::operator<<(poVar2,(Polynomial<double> *)&outF);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&outF);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &filterLowPass2nd);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<((ostream *)&std::cout,"Complex Multiplication");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"p1 * (2 + 2i) = ");
  emptyFilter.tf_.samplingFrequency_ = 2.0;
  emptyFilter.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4000000000000000;
  filterLowPass6th.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  filterLowPass6th.tf_.samplingFrequency_ = (double)&emptyFilter;
  rtb::Filter::Polynomial<double>::Polynomial
            ((Polynomial<double> *)&filterLowPass2nd,
             (initializer_list<std::complex<double>_> *)&filterLowPass6th);
  rtb::Filter::multiply<double>
            ((Polynomial<double> *)&outF,&p1,(Polynomial<double> *)&filterLowPass2nd);
  poVar2 = rtb::Filter::operator<<(poVar2,(Polynomial<double> *)&outF);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&outF);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &filterLowPass2nd);
  poVar2 = std::operator<<((ostream *)&std::cout,"p2 * (3 - 3i) = ");
  emptyFilter.tf_.samplingFrequency_ = 3.0;
  emptyFilter.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc008000000000000;
  filterLowPass6th.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  filterLowPass6th.tf_.samplingFrequency_ = (double)&emptyFilter;
  rtb::Filter::Polynomial<double>::Polynomial
            ((Polynomial<double> *)&filterLowPass2nd,
             (initializer_list<std::complex<double>_> *)&filterLowPass6th);
  rtb::Filter::multiply<double>
            ((Polynomial<double> *)&outF,&p2,(Polynomial<double> *)&filterLowPass2nd);
  poVar2 = rtb::Filter::operator<<(poVar2,(Polynomial<double> *)&outF);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&outF);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &filterLowPass2nd);
  poVar2 = std::operator<<((ostream *)&std::cout,"p3 * (4 + 4i) = ");
  emptyFilter.tf_.samplingFrequency_ = 4.0;
  emptyFilter.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4010000000000000;
  filterLowPass6th.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  filterLowPass6th.tf_.samplingFrequency_ = (double)&emptyFilter;
  rtb::Filter::Polynomial<double>::Polynomial
            ((Polynomial<double> *)&filterLowPass2nd,
             (initializer_list<std::complex<double>_> *)&filterLowPass6th);
  rtb::Filter::multiply<double>
            ((Polynomial<double> *)&outF,&p3,(Polynomial<double> *)&filterLowPass2nd);
  poVar2 = rtb::Filter::operator<<(poVar2,(Polynomial<double> *)&outF);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&outF);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &filterLowPass2nd);
  poVar2 = std::operator<<((ostream *)&std::cout,"p4 * (5 - 5i) = ");
  emptyFilter.tf_.samplingFrequency_ = 5.0;
  emptyFilter.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc014000000000000;
  filterLowPass6th.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  filterLowPass6th.tf_.samplingFrequency_ = (double)&emptyFilter;
  rtb::Filter::Polynomial<double>::Polynomial
            ((Polynomial<double> *)&filterLowPass2nd,
             (initializer_list<std::complex<double>_> *)&filterLowPass6th);
  rtb::Filter::multiply<double>
            ((Polynomial<double> *)&outF,&p4,(Polynomial<double> *)&filterLowPass2nd);
  poVar2 = rtb::Filter::operator<<(poVar2,(Polynomial<double> *)&outF);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&outF);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &filterLowPass2nd);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<((ostream *)&std::cout,"Polynomial Multiplication");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"p1 * p1 = ");
  rtb::Filter::multiply<double>((Polynomial<double> *)&outF,&p1,&p1);
  poVar2 = rtb::Filter::operator<<(poVar2,(Polynomial<double> *)&outF);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&outF);
  poVar2 = std::operator<<((ostream *)&std::cout,"p2 * p1 = ");
  rtb::Filter::multiply<double>((Polynomial<double> *)&outF,&p2,&p1);
  poVar2 = rtb::Filter::operator<<(poVar2,(Polynomial<double> *)&outF);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&outF);
  poVar2 = std::operator<<((ostream *)&std::cout,"p3 * p1 = ");
  rtb::Filter::multiply<double>((Polynomial<double> *)&outF,&p3,&p1);
  poVar2 = rtb::Filter::operator<<(poVar2,(Polynomial<double> *)&outF);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&outF);
  poVar2 = std::operator<<((ostream *)&std::cout,"p4 * p1 = ");
  rtb::Filter::multiply<double>((Polynomial<double> *)&outF,&p4,&p1);
  poVar2 = rtb::Filter::operator<<(poVar2,(Polynomial<double> *)&outF);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&outF);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<((ostream *)&std::cout,"Polynomial Addition");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"p1 + p1 = ");
  rtb::Filter::add<double>((Polynomial<double> *)&outF,&p1,&p1);
  poVar2 = rtb::Filter::operator<<(poVar2,(Polynomial<double> *)&outF);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&outF);
  poVar2 = std::operator<<((ostream *)&std::cout,"p2 + p1 = ");
  rtb::Filter::add<double>((Polynomial<double> *)&outF,&p2,&p1);
  poVar2 = rtb::Filter::operator<<(poVar2,(Polynomial<double> *)&outF);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&outF);
  poVar2 = std::operator<<((ostream *)&std::cout,"p3 + p1 = ");
  rtb::Filter::add<double>((Polynomial<double> *)&outF,&p3,&p1);
  poVar2 = rtb::Filter::operator<<(poVar2,(Polynomial<double> *)&outF);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&outF);
  poVar2 = std::operator<<((ostream *)&std::cout,"p4 + p1 = ");
  rtb::Filter::add<double>((Polynomial<double> *)&outF,&p4,&p1);
  poVar2 = rtb::Filter::operator<<(poVar2,(Polynomial<double> *)&outF);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&outF);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<((ostream *)&std::cout,"--------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"|        TEST #2         |");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"|    TransferFunction    |");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"--------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Coefficients are normalised to the denominator");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Pole-zero simplifications are NOT implemented");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"TF = p1/p2 ");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  rtb::Filter::TransferFunction<double>::TransferFunction((TransferFunction<double> *)&outF,&p1,&p2)
  ;
  poVar2 = rtb::Filter::operator<<(poVar2,(TransferFunction<double> *)&outF);
  std::endl<char,std::char_traits<char>>(poVar2);
  rtb::Filter::TransferFunction<double>::~TransferFunction((TransferFunction<double> *)&outF);
  poVar2 = std::operator<<((ostream *)&std::cout,"TF = p2/p2 ");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  rtb::Filter::TransferFunction<double>::TransferFunction((TransferFunction<double> *)&outF,&p2,&p2)
  ;
  poVar2 = rtb::Filter::operator<<(poVar2,(TransferFunction<double> *)&outF);
  std::endl<char,std::char_traits<char>>(poVar2);
  rtb::Filter::TransferFunction<double>::~TransferFunction((TransferFunction<double> *)&outF);
  poVar2 = std::operator<<((ostream *)&std::cout,"TF = p3/p2 ");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  rtb::Filter::TransferFunction<double>::TransferFunction((TransferFunction<double> *)&outF,&p3,&p2)
  ;
  poVar2 = rtb::Filter::operator<<(poVar2,(TransferFunction<double> *)&outF);
  std::endl<char,std::char_traits<char>>(poVar2);
  rtb::Filter::TransferFunction<double>::~TransferFunction((TransferFunction<double> *)&outF);
  poVar2 = std::operator<<((ostream *)&std::cout,"TF = p4/p3 ");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  rtb::Filter::TransferFunction<double>::TransferFunction((TransferFunction<double> *)&outF,&p4,&p3)
  ;
  poVar2 = rtb::Filter::operator<<(poVar2,(TransferFunction<double> *)&outF);
  std::endl<char,std::char_traits<char>>(poVar2);
  rtb::Filter::TransferFunction<double>::~TransferFunction((TransferFunction<double> *)&outF);
  poVar2 = std::operator<<((ostream *)&std::cout,"TF = p3/p4 ");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  rtb::Filter::TransferFunction<double>::TransferFunction((TransferFunction<double> *)&outF,&p3,&p4)
  ;
  poVar2 = rtb::Filter::operator<<(poVar2,(TransferFunction<double> *)&outF);
  std::endl<char,std::char_traits<char>>(poVar2);
  rtb::Filter::TransferFunction<double>::~TransferFunction((TransferFunction<double> *)&outF);
  poVar2 = std::operator<<((ostream *)&std::cout,"TF = (1+2i)/p2 ");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  emptyFilter.tf_.samplingFrequency_ = 1.0;
  emptyFilter.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4000000000000000;
  filterLowPass6th.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  filterLowPass6th.tf_.samplingFrequency_ = (double)&emptyFilter;
  rtb::Filter::Polynomial<double>::Polynomial
            ((Polynomial<double> *)&filterLowPass2nd,
             (initializer_list<std::complex<double>_> *)&filterLowPass6th);
  rtb::Filter::TransferFunction<double>::TransferFunction
            ((TransferFunction<double> *)&outF,(Polynomial<double> *)&filterLowPass2nd,&p2);
  poVar2 = rtb::Filter::operator<<(poVar2,(TransferFunction<double> *)&outF);
  std::endl<char,std::char_traits<char>>(poVar2);
  rtb::Filter::TransferFunction<double>::~TransferFunction((TransferFunction<double> *)&outF);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &filterLowPass2nd);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<((ostream *)&std::cout,"--------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"|        TEST #3         |");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"|    Filter Designer     |");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"--------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "IIR Filter, 2nd Order Low Pass Butterworth, cutoff frequency 6Hz, sample frequency 1000Hz"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  rtb::Filter::butter<double>(&lowPass2nd,2,6.0,1000.0);
  rtb::Filter::operator<<((ostream *)&std::cout,&lowPass2nd);
  std::__cxx11::string::string((string *)&local_388,"lowPass2nd_bode.csv",(allocator *)&outF);
  bodeDiagram<double>(&lowPass2nd,&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "IIR Filter, 6th Order Low Pass Butterworth, cutoff frequency 300Hz, sample frequency 1000Hz"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  rtb::Filter::butter<double>(&lowPass6th,6,300.0,1000.0);
  rtb::Filter::operator<<((ostream *)&std::cout,&lowPass6th);
  std::__cxx11::string::string((string *)&local_3a8,"lowPass6th_bode.csv",(allocator *)&outF);
  bodeDiagram<double>(&lowPass6th,&local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<((ostream *)&std::cout,"--------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"|        TEST #4         |");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"|     Step Response      |");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"--------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "IIR Filter, 2nd Order Low Pass Butterworth, cutoff frequency 6Hz, sample frequency 1000Hz"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  rtb::Filter::Filter<double>::Filter(&filterLowPass2nd,&lowPass2nd);
  std::__cxx11::string::string((string *)&local_3c8,"lowPass2nd_step.csv",(allocator *)&outF);
  stepResponse<double>(&filterLowPass2nd,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "IIR Filter, 6th Order Low Pass Butterworth, cutoff frequency 300Hz, sample frequency 1000Hz"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  rtb::Filter::Filter<double>::Filter(&filterLowPass6th,&lowPass6th);
  std::__cxx11::string::string((string *)&local_3e8,"lowPass6th_step.csv",(allocator *)&outF);
  stepResponse<double>(&filterLowPass6th,&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  ssFilter.lastTime_ = INFINITY;
  ssFilter.lastSecondDerivative_ = 0.0;
  ssFilter.lastValue_ = 0.0;
  ssFilter.lastFirstDerivative_ = 0.0;
  puVar4 = &DAT_0010a740;
  poVar5 = &outF;
  for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)poVar5 = *puVar4;
    puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
    poVar5 = poVar5 + (ulong)bVar7 * -0x10 + 8;
  }
  __l._M_len = 0xc;
  __l._M_array = (iterator)&outF;
  std::vector<double,_std::allocator<double>_>::vector(&times,__l,(allocator_type *)&emptyFilter);
  std::ofstream::ofstream(&outF,"stateSpaceFilter_300_step.csv",_S_out);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Printing step response to stateSpaceFilter_300_step.csv");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::ostream::_M_insert<double>(0.0);
  std::operator<<(poVar2,", ");
  poVar2 = std::ostream::_M_insert<double>(0.0);
  std::operator<<(poVar2,", ");
  dVar1 = rtb::Filter::StateSpaceFilter<double>::filter(&ssFilter,0.0,0.0,300.0);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  for (pdVar6 = times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar6 != times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar6 = pdVar6 + 1) {
    dVar1 = *pdVar6;
    poVar2 = std::ostream::_M_insert<double>(dVar1);
    std::operator<<(poVar2,", ");
    poVar2 = std::ostream::_M_insert<double>(1.0);
    std::operator<<(poVar2,", ");
    dVar1 = rtb::Filter::StateSpaceFilter<double>::filter(&ssFilter,1.0,dVar1,300.0);
    poVar2 = std::ostream::_M_insert<double>(dVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::ofstream::close();
  poVar2 = std::operator<<((ostream *)&std::cout,"--------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"|        TEST #5         |");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"|Filter def. constructor |");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"--------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  rtb::Filter::Filter<double>::Filter(&emptyFilter);
  rtb::Filter::Filter<double>::setTransferFunction(&emptyFilter,&lowPass2nd);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Late initialization. IIR Filter, 2nd Order Low Pass Butterworth, cutoff frequency 6Hz, sample frequency 1000Hz"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string
            ((string *)&local_408,"lowPass2nd_step_lateInit.csv",(allocator *)&maFilter);
  stepResponse<double>(&emptyFilter,&local_408);
  std::__cxx11::string::~string((string *)&local_408);
  poVar2 = std::operator<<((ostream *)&std::cout,"Step response for state space filter with f0=8Hz")
  ;
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string((string *)&local_428,"ssfilter8Hz_step.csv",(allocator *)&maFilter);
  stepResponse<double>(&ssFilter,8.0,&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  poVar2 = std::operator<<((ostream *)&std::cout,"Step response for moving average filter");
  std::endl<char,std::char_traits<char>>(poVar2);
  maFilter.tf_.samplingFrequency_ = 0.05;
  std::vector<double,_std::allocator<double>_>::vector
            (&bMa,0x14,(value_type_conflict1 *)&maFilter,(allocator_type *)&local_278);
  maFilter.tf_.samplingFrequency_ = 1.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&aMa,1,(value_type_conflict1 *)&maFilter,(allocator_type *)&local_278);
  rtb::Filter::Polynomial<double>::Polynomial(&local_340,&bMa);
  rtb::Filter::Polynomial<double>::Polynomial(&local_368,&aMa);
  rtb::Filter::TransferFunction<double>::TransferFunction(&local_278,&local_340,&local_368);
  rtb::Filter::Filter<double>::Filter(&maFilter,&local_278);
  rtb::Filter::TransferFunction<double>::~TransferFunction(&local_278);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &local_368);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &local_340);
  std::__cxx11::string::string
            ((string *)&local_478,"moving_avg_filter_step.csv",(allocator *)&local_278);
  stepResponse<double>(&maFilter,&local_478);
  std::__cxx11::string::~string((string *)&local_478);
  exit(0);
}

Assistant:

int main() {

    typedef std::complex<double> Complex;
    cout << "--------------------------" << endl;
    cout << "|        TEST #1         |" << endl;
    cout << "|       Polynomial       |" << endl;
    cout << "--------------------------" << endl;

    Polynomial<double> p1{ 1, 2 };
    Polynomial<double> p2{ 1, -2, 0 };
    Polynomial<double> p3{ 0, 2, 3, 4 };
    Polynomial<double> p4{ 5 };

    cout << "p1 =" << p1;
    cout << "p2 =" << p2;
    cout << "p3 =" << p3;
    cout << "p4 =" << p4;
    cout << endl;
    cout << "Scalar Multiplication" << endl;
    cout << "p1 * 2 = " << multiply<double>(p1, { 2 }) << endl;
    cout << "p2 * 3 = " << multiply<double>(p2, { 3 }) << endl;
    cout << "p3 * 4 = " << multiply<double>(p3, { 4 }) << endl;
    cout << "p4 * 5 = " << multiply<double>(p4, { 5 }) << endl;
    cout << endl;
    cout << "Complex Multiplication" << endl;
    cout << "p1 * (2 + 2i) = " << multiply<double>(p1, { Complex(2, 2) }) << endl;
    cout << "p2 * (3 - 3i) = " << multiply<double>(p2, { Complex(3, -3) }) << endl;
    cout << "p3 * (4 + 4i) = " << multiply<double>(p3, { Complex(4, 4) }) << endl;
    cout << "p4 * (5 - 5i) = " << multiply<double>(p4, { Complex(5, -5) }) << endl;
    cout << endl;
    cout << "Polynomial Multiplication" << endl;
    cout << "p1 * p1 = " << p1*p1 << endl;
    cout << "p2 * p1 = " << p2*p1 << endl;
    cout << "p3 * p1 = " << p3*p1 << endl;
    cout << "p4 * p1 = " << p4*p1 << endl;
    cout << endl;
    cout << "Polynomial Addition" << endl;
    cout << "p1 + p1 = " << add<double>(p1, p1) << endl;
    cout << "p2 + p1 = " << add<double>(p2, p1) << endl;
    cout << "p3 + p1 = " << add<double>(p3, p1) << endl;
    cout << "p4 + p1 = " << add<double>(p4, p1) << endl;
    cout << endl;

    cout << "--------------------------" << endl;
    cout << "|        TEST #2         |" << endl;
    cout << "|    TransferFunction    |" << endl;
    cout << "--------------------------" << endl;
    cout << "Coefficients are normalised to the denominator" << endl;
    cout << "Pole-zero simplifications are NOT implemented" << endl;
    cout << "TF = p1/p2 " << endl << TransferFunction<double>(p1, p2) << endl;
    cout << "TF = p2/p2 " << endl << TransferFunction<double>(p2, p2) << endl;
    cout << "TF = p3/p2 " << endl << TransferFunction<double>(p3, p2) << endl;
    cout << "TF = p4/p3 " << endl << TransferFunction<double>(p4, p3) << endl;
    cout << "TF = p3/p4 " << endl << TransferFunction<double>(p3, p4) << endl;
    cout << "TF = (1+2i)/p2 " << endl << TransferFunction<double>({ { 1, 2 } }, p2) << endl;
    cout << endl;

    cout << "--------------------------" << endl;
    cout << "|        TEST #3         |" << endl;
    cout << "|    Filter Designer     |" << endl;
    cout << "--------------------------" << endl;
    cout << "IIR Filter, 2nd Order Low Pass Butterworth, cutoff frequency 6Hz, sample frequency 1000Hz" << endl;
    TransferFunction<double> lowPass2nd(butter<double>(2, 6, 1000));
    cout << lowPass2nd;
    bodeDiagram(lowPass2nd, "lowPass2nd_bode.csv");
    cout << endl;

    cout << "IIR Filter, 6th Order Low Pass Butterworth, cutoff frequency 300Hz, sample frequency 1000Hz" << endl;
    TransferFunction<double> lowPass6th(butter<double>(6, 300, 1000));
    cout << lowPass6th;
    bodeDiagram(lowPass6th, "lowPass6th_bode.csv");
    cout << endl;

    cout << "--------------------------" << endl;
    cout << "|        TEST #4         |" << endl;
    cout << "|     Step Response      |" << endl;
    cout << "--------------------------" << endl;

    cout << "IIR Filter, 2nd Order Low Pass Butterworth, cutoff frequency 6Hz, sample frequency 1000Hz" << endl;
    Filter<double> filterLowPass2nd(lowPass2nd);
    stepResponse<double>(filterLowPass2nd, "lowPass2nd_step.csv");
    cout << endl;
    cout << "IIR Filter, 6th Order Low Pass Butterworth, cutoff frequency 300Hz, sample frequency 1000Hz" << endl;
    Filter<double> filterLowPass6th(lowPass6th);
    stepResponse<double>(filterLowPass6th, "lowPass6th_step.csv");
    cout << endl;

    StateSpaceFilter<double> ssFilter;
    std::vector<double> times = { 0.01, 0.02, 0.032, 0.038, 0.05, 0.063, 0.07, 0.09, 0.102, 0.11, 0.119, 0.14 };
    std::ofstream outF("stateSpaceFilter_300_step.csv");
    cout << "Printing step response to stateSpaceFilter_300_step.csv" << endl;
    outF << 0.0 << ", " << 0.0 << ", " << ssFilter.filter(0.0, 0.0, 300) << std::endl;
    for (auto t : times)
        outF << t << ", " << 1.0 << ", " << ssFilter.filter(1.0, t, 300) << std::endl;
    outF.close();

    cout << "--------------------------" << endl;
    cout << "|        TEST #5         |" << endl;
    cout << "|Filter def. constructor |" << endl;
    cout << "--------------------------" << endl;

    Filter<double> emptyFilter;
    emptyFilter.setTransferFunction(lowPass2nd);
    cout << "Late initialization. IIR Filter, 2nd Order Low Pass Butterworth, cutoff frequency 6Hz, sample frequency 1000Hz" << endl;
    stepResponse<double>(emptyFilter, "lowPass2nd_step_lateInit.csv");

    cout << "Step response for state space filter with f0=8Hz" << endl;
    StateSpaceFilter<double> ssfiler;
    stepResponse<double>(ssFilter, 8, "ssfilter8Hz_step.csv");

    cout << "Step response for moving average filter" << endl;
    std::vector<double> bMa(20, 1. / 20.);
    std::vector<double> aMa(1, 1.);

    Filter<double> maFilter(TransferFunction<>(bMa, aMa));
    stepResponse<double>(maFilter, "moving_avg_filter_step.csv");

    /*
    std::cout << "p1 = " << p1;
    std::cout << "p1(3) = " << p1.solveFor(-1) << std::endl;

    //step response
    std::vector<double> zeroes(1, 0.0);
    std::vector<double> ones(1000, 1.0);
    std::vector<double> step(zeroes);
    step.insert(step.end(), ones.begin(), ones.end());

    TransferFunction<double> tfDesigned(Designer::butter2ndOrder<double>(6, 1000.));

    std::cout << "Designed filter\n";
    std::cout << tfDesigned.getSamplingFrequency() << std::endl;
    Filter<double> filter(tfDesigned);

    Filter<double> filter4th(Designer::butter<double>(4, 6, 1000));

    //std::cout << filter;
    //std::cout << filter4th;
    //      std::cout << filterDouble;

    /*
    std::ofstream oF("output.csv");
    for (double val : step)
    oF << val << "," << std::abs(filter.filter(val)) << "," << std::abs(filter4th.filter(val)) << std::endl;
    oF.close();

    std::ofstream oFBode("bode_gain.csv");
    std::vector<double> xValues, gain, phase;
    tfDesigned.getBode(xValues, gain, phase);
    for (unsigned i{ 0 }; i < xValues.size(); ++i)
    oFBode << xValues.at(i) << "," << gain.at(i) << "," << phase.at(i) << std::endl;
    oFBode.close();
    /*
    std::ofstream oFBodePhase("bode_phase.csv");
    for (unsigned i{ 1 }; i < 1000; ++i)
    oFBodePhase << M_PI / 1000 * i << "," << tfDesigned.getPhaseAt(M_PI / 1000 * i) << std::endl;
    oFBodePhase.close();

    /*

    //test filtfilt
    vector<double> firstPass(filter.pass(step));
    std::reverse(firstPass.begin(), firstPass.end());
    vector<double> secondPass(filter.pass(firstPass));
    std::reverse(secondPass.begin(), secondPass.end());

    std::reverse(firstPass.begin(), firstPass.end());

    std::ofstream oF2("filtfilt.csv");
    for (unsigned i{ 0 }; i < step.size(); ++i)
    oF2 << step.at(i) << "," << firstPass.at(i) << "," << secondPass.at(i) << std::endl;
    oF2.close();

    /*

    //test linear phase fir filter
    std::vector<double> firB( {
    0.00127199776427371,
    0.00175973248875467,
    -0.000474050123699974,
    -0.00507655778150986,
    -0.00730622779100510,
    -0.00139834985893385,
    0.0118182305510141,
    0.0208600394665444,
    0.0108509633977398,
    -0.0201948738097724,
    -0.0503421398292688,
    -0.0426075899832280,
    0.0273002961309331,
    0.144919701151270,
    0.257048286517307,
    0.303233271924363,
    0.257048286517307,
    0.144919701151270,
    0.0273002961309331,
    -0.0426075899832280,
    -0.0503421398292688,
    -0.0201948738097724,
    0.0108509633977398,
    0.0208600394665444,
    0.0118182305510141,
    -0.00139834985893385,
    -0.00730622779100510,
    -0.00507655778150986,
    -0.000474050123699974,
    0.00175973248875467,
    0.00127199776427371
    } );

    Polynomial<> n(firB), d{ 1 };

    TransferFunction<> tfFir(n, d);
    Filter<> firFilter(tfFir);
    vector<double> resultFir(firFilter.pass(step));

    std::ofstream oF3("comparison.csv");
    for (unsigned i{ 0 }; i < step.size(); ++i)
    oF3 << step.at(i) << "," << firstPass.at(i) << "," << secondPass.at(i) << ", " << resultFir.at(i) << std::endl;
    oF3.close();

    */
    //      TransferFunction<double> h1(p1, p2);

    //std::cout << add(p, Polynomial<double>(std::vector<double>{ 1, 2, 3, 4 }));

    std::exit(EXIT_SUCCESS);
}